

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O2

void GraphTask::run_bfs(task_data *D,multi_ex *ec)

{
  int iVar1;
  pointer pvVar2;
  unsigned_long uVar3;
  example *peVar4;
  wclass *pwVar5;
  pointer puVar6;
  ulong uVar7;
  pointer puVar8;
  ulong uVar9;
  pointer puVar10;
  uint uVar11;
  size_t n;
  ulong uVar12;
  long lVar13;
  reference rVar14;
  uint local_84;
  task_data *local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_78;
  ulong local_70;
  pointer local_68;
  pointer local_60;
  vector<bool,_std::allocator<bool>_> touched;
  
  puVar6 = (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar6) {
    (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar6;
  }
  touched.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  touched.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  touched.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_78 = &D->bfs;
  touched.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  touched.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_80 = D;
  for (uVar12 = 0; uVar12 < local_80->N; uVar12 = uVar12 + 1) {
    std::vector<bool,_std::allocator<bool>_>::push_back(&touched,false);
  }
  rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](&touched,0);
  *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
  local_84 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (local_78,&local_84);
  uVar12 = 0;
  do {
    do {
      puVar6 = (local_80->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      puVar8 = (local_80->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)local_80->N <= (ulong)((long)puVar6 - (long)puVar8 >> 2)) {
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                  (&touched.super__Bvector_base<std::allocator<bool>_>);
        return;
      }
      while (uVar7 = (long)puVar6 - (long)puVar8 >> 2, uVar12 < uVar7) {
        pvVar2 = (local_80->adj).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_68 = *(pointer *)
                    ((long)&pvVar2[puVar8[uVar12]].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data + 8);
        puVar10 = pvVar2[puVar8[uVar12]].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_70 = uVar12;
        while (puVar10 != local_68) {
          uVar3 = *puVar10;
          lVar13 = 4;
          local_60 = puVar10;
          for (uVar12 = 0;
              peVar4 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar3], pwVar5 = (peVar4->l).cs.costs._begin
              , uVar12 < (ulong)((long)(peVar4->l).cs.costs._end - (long)pwVar5 >> 4);
              uVar12 = uVar12 + 1) {
            iVar1 = *(int *)((long)&pwVar5->x + lVar13);
            if (iVar1 != 0) {
              uVar11 = iVar1 - 1;
              rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](&touched,(ulong)uVar11);
              if ((*rVar14._M_p & rVar14._M_mask) == 0) {
                local_84 = uVar11;
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                          (local_78,&local_84);
                rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   (&touched,(ulong)uVar11);
                *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
              }
            }
            lVar13 = lVar13 + 0x10;
          }
          puVar10 = local_60 + 1;
        }
        puVar8 = (local_80->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar6 = (local_80->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        uVar12 = local_70 + 1;
      }
      uVar9 = (ulong)local_80->N;
    } while (uVar9 <= uVar7);
    for (local_84 = 0; local_84 < (uint)uVar9; local_84 = local_84 + 1) {
      rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](&touched,(ulong)local_84);
      if ((*rVar14._M_p & rVar14._M_mask) == 0) {
        rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](&touched,(ulong)local_84);
        *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_78,&local_84);
        break;
      }
      uVar9 = (ulong)local_80->N;
    }
  } while( true );
}

Assistant:

void run_bfs(task_data& D, multi_ex& ec)
{
  D.bfs.clear();
  vector<bool> touched;
  for (size_t n = 0; n < D.N; n++) touched.push_back(false);

  touched[0] = true;
  D.bfs.push_back(0);

  size_t i = 0;
  while (D.bfs.size() < D.N)
  {
    while (i < D.bfs.size())
    {
      uint32_t n = D.bfs[i];
      for (size_t id : D.adj[n])
        for (size_t j = 0; j < ec[id]->l.cs.costs.size(); j++)
        {
          uint32_t m = ec[id]->l.cs.costs[j].class_index;
          if ((m > 0) && (!touched[m - 1]))
          {
            D.bfs.push_back(m - 1);
            touched[m - 1] = true;
          }
        }
      i++;
    }

    if (D.bfs.size() < D.N)
      // we finished a SCC, need to find another
      for (uint32_t n = 0; n < D.N; n++)
        if (!touched[n])
        {
          touched[n] = true;
          D.bfs.push_back(n);
          break;
        }
  }
}